

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_14UL> *params_2,
          ArrayPtr<const_char> *params_3,CappedArray<char,_14UL> *params_4,
          ArrayPtr<const_char> *params_5,StringPtr *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_t size;
  char *target;
  long local_78 [2];
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  long local_48;
  size_t local_40;
  size_t local_38;
  
  local_78[0] = *(long *)(this + 8);
  local_78[1] = params->size_;
  local_68 = params_1->ptr;
  local_60 = *(undefined8 *)params_2->content;
  local_58 = params_3->ptr;
  local_50 = *(undefined8 *)params_4->content;
  local_48 = params_5->size_ - 1;
  local_40 = (params_6->content).size_;
  local_38 = params_7->size_;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_78 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x48);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  lVar2 = *(long *)(this + 8);
  if (lVar2 != 0) {
    lVar1 = *(long *)this;
    lVar3 = 0;
    do {
      target[lVar3] = *(char *)(lVar1 + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    target = target + lVar3;
  }
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,params,(CappedArray<char,_14UL> *)params_1,(ArrayPtr<const_char> *)params_2,
             (CappedArray<char,_14UL> *)params_3,(ArrayPtr<const_char> *)params_4,
             (StringPtr *)params_5,&params_6->content,params_7);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}